

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<char,char&>&,char,char&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [39],
               DebugComparison<char,_char_&> *params_1,char *params_2,char *params_3)

{
  char cVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  ArrayPtr<kj::String> argValues;
  undefined4 in_register_00000014;
  long lVar5;
  String *result;
  undefined1 in_stack_ffffffffffffff48 [14];
  char cVar6;
  _ _Var7;
  String local_a8;
  char *local_90;
  size_t local_88;
  ArrayDisposer *pAStack_80;
  String local_78;
  String local_60;
  String local_48;
  
  str<char_const(&)[39]>
            (&local_a8,(kj *)params,(char (*) [39])CONCAT44(in_register_00000014,severity));
  _Var7 = (_)params_1->left;
  cVar6 = *params_1->right;
  concat<kj::FixedArray<char,1ul>,kj::StringPtr&,kj::FixedArray<char,1ul>>
            (&local_48,(_ *)&stack0xffffffffffffff57,(FixedArray<char,_1UL> *)&params_1->op,
             (StringPtr *)&stack0xffffffffffffff56,(FixedArray<char,_1UL> *)params);
  local_90 = local_48.content.ptr;
  local_88 = local_48.content.size_;
  pAStack_80 = local_48.content.disposer;
  cVar1 = *params_2;
  heapString(&local_78,1);
  if ((char *)local_78.content.size_ != (char *)0x0) {
    local_78.content.size_ = (size_t)local_78.content.ptr;
  }
  *(char *)local_78.content.size_ = cVar1;
  cVar1 = *params_3;
  heapString(&local_60,1);
  if ((char *)local_60.content.size_ != (char *)0x0) {
    local_60.content.size_ = (size_t)local_60.content.ptr;
  }
  *(char *)local_60.content.size_ = cVar1;
  argValues.size_._6_1_ = cVar6;
  argValues._0_14_ = in_stack_ffffffffffffff48;
  argValues.size_._7_1_ = _Var7;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)&local_a8,argValues);
  lVar5 = 0x48;
  do {
    lVar2 = *(long *)((long)&local_a8.content.ptr + lVar5);
    if (lVar2 != 0) {
      uVar3 = *(undefined8 *)((long)&local_a8.content.size_ + lVar5);
      *(undefined8 *)((long)&local_a8.content.ptr + lVar5) = 0;
      *(undefined8 *)((long)&local_a8.content.size_ + lVar5) = 0;
      puVar4 = *(undefined8 **)((long)&local_a8.content.disposer + lVar5);
      (**(code **)*puVar4)(puVar4,lVar2,1,uVar3,uVar3,0);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}